

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

void SGParser::Generator::FollowPos
               (RegExprDFANode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *nodelist)

{
  pointer __s2;
  pointer __s1;
  pointer puVar1;
  pointer ppRVar2;
  int iVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  RegExprDFANode *pRVar5;
  size_t __n;
  RegExprDFANode *pRVar6;
  
  pRVar6 = node->pParent;
  if (pRVar6 != (RegExprDFANode *)0x0) {
    do {
      __s2 = (node->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
      __n = (long)(node->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)__s2;
      while( true ) {
        __s1 = (pRVar6->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
        puVar1 = (pRVar6->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)puVar1 - (long)__s1 != __n) ||
           ((puVar1 != __s1 && (iVar3 = bcmp(__s1,__s2,__n), iVar3 != 0)))) break;
        pRVar6 = pRVar6->pParent;
        if (pRVar6 == (RegExprDFANode *)0x0) {
          return;
        }
      }
      if (pRVar6->Type == Star) {
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (__s1,puVar1,&node->Position);
        pRVar5 = pRVar6;
        if (_Var4._M_current ==
            (pRVar6->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          return;
        }
LAB_0013d11a:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)nodelist,
                   (nodelist->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (pRVar5->FirstPos).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pRVar5->FirstPos).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      else if (pRVar6->Type == And) {
        pRVar5 = *(pRVar6->Children).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          ((pRVar5->LastPos).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           *(pointer *)
                            ((long)&(pRVar5->LastPos).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl + 8),&node->Position);
        ppRVar2 = (pRVar6->Children).
                  super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (_Var4._M_current ==
            *(pointer *)
             ((long)&((*ppRVar2)->LastPos).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)) {
          return;
        }
        pRVar5 = ppRVar2[1];
        goto LAB_0013d11a;
      }
      pRVar6 = pRVar6->pParent;
    } while (pRVar6 != (RegExprDFANode *)0x0);
  }
  return;
}

Assistant:

void FollowPos(const RegExprDFANode& node, std::vector<unsigned>& nodelist) {
    bool done  = false;
    auto pnode = node.pParent;

    while (pnode && !done) {
        if (pnode->LastPos == node.LastPos) {
            pnode = pnode->pParent;
            continue;
        }

        switch (pnode->Type) {
            case RegExprDFANode::NodeType::And:
                if (std::find(pnode->Children[0u]->LastPos.begin(),
                              pnode->Children[0u]->LastPos.end(), node.Position) !=
                    pnode->Children[0u]->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->Children[1u]->FirstPos.begin(),
                                    pnode->Children[1u]->FirstPos.end());
                else
                    done = true;
                break;

            case RegExprDFANode::NodeType::Star:
                if (std::find(pnode->LastPos.begin(), pnode->LastPos.end(), node.Position) !=
                    pnode->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->FirstPos.begin(),
                                    pnode->FirstPos.end());
                else
                    done = true;
                break;

            default:
                break;
        }

        pnode = pnode->pParent;
    }
}